

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmClassDefinition
                    (ExpressionContext *ctx,VmModule *module,ExprClassDefinition *node)

{
  Allocator *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  VmValue *pVVar3;
  
  iVar2 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
  pVVar3 = (VmValue *)CONCAT44(extraout_var,iVar2);
  pAVar1 = module->allocator;
  pVVar3->typeID = 0;
  pVVar3->source = (SynBase *)0x0;
  (pVVar3->comment).begin = (char *)0x0;
  (pVVar3->type).type = VM_TYPE_VOID;
  (pVVar3->type).size = 0;
  (pVVar3->type).structType = (TypeBase *)0x0;
  (pVVar3->comment).end = (char *)0x0;
  (pVVar3->users).allocator = pAVar1;
  (pVVar3->users).data = (pVVar3->users).little;
  (pVVar3->users).count = 0;
  (pVVar3->users).max = 8;
  pVVar3->hasSideEffects = false;
  pVVar3->hasMemoryAccess = false;
  pVVar3->canBeRemoved = true;
  pVVar3->hasKnownSimpleUse = false;
  pVVar3->hasKnownNonSimpleUse = false;
  pVVar3->_vptr_VmValue = (_func_int **)&PTR__VmValue_00249c60;
  pVVar3 = anon_unknown.dwarf_13465d::CheckType(ctx,&node->super_ExprBase,pVVar3);
  return pVVar3;
}

Assistant:

VmValue* CompileVmClassDefinition(ExpressionContext &ctx, VmModule *module, ExprClassDefinition *node)
{
	return CheckType(ctx, node, CreateVoid(module));
}